

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz.h
# Opt level: O0

void __thiscall
wavingz::demod::demod_nrz::demod_nrz
          (demod_nrz *this,size_t sample_rate,
          function<void_(unsigned_char_*,_unsigned_char_*)> *packet_callback)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  tuple<double,_std::array<double,_4UL>,_std::array<double,_4UL>_> local_1b0;
  tuple<double,_std::array<double,_4UL>,_std::array<double,_4UL>_> local_168;
  tuple<double,_std::array<double,_7UL>,_std::array<double,_7UL>_> local_110;
  tuple<double,_std::array<double,_7UL>,_std::array<double,_7UL>_> local_98;
  function<void_(unsigned_char_*,_unsigned_char_*)> *local_20;
  function<void_(unsigned_char_*,_unsigned_char_*)> *packet_callback_local;
  size_t sample_rate_local;
  demod_nrz *this_local;
  
  local_20 = packet_callback;
  packet_callback_local = (function<void_(unsigned_char_*,_unsigned_char_*)> *)sample_rate;
  sample_rate_local = (size_t)this;
  atan_fm_demodulator::atan_fm_demodulator(&this->fsk_demod);
  auVar1._8_4_ = (int)((ulong)packet_callback_local >> 0x20);
  auVar1._0_8_ = packet_callback_local;
  auVar1._12_4_ = 0x45300000;
  butter_lp<6>(&local_98,
               (auVar1._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)packet_callback_local) - 4503599627370496.0),
               150000.0);
  iir_filter<6>::iir_filter(&this->lp1,&local_98);
  auVar2._8_4_ = (int)((ulong)packet_callback_local >> 0x20);
  auVar2._0_8_ = packet_callback_local;
  auVar2._12_4_ = 0x45300000;
  butter_lp<6>(&local_110,
               (auVar2._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)packet_callback_local) - 4503599627370496.0),
               150000.0);
  iir_filter<6>::iir_filter(&this->lp2,&local_110);
  auVar3._8_4_ = (int)((ulong)packet_callback_local >> 0x20);
  auVar3._0_8_ = packet_callback_local;
  auVar3._12_4_ = 0x45300000;
  butter_lp<3>(&local_168,
               (auVar3._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)packet_callback_local) - 4503599627370496.0),
               50000.0);
  iir_filter<3>::iir_filter(&this->freq_filter,&local_168);
  auVar4._8_4_ = (int)((ulong)packet_callback_local >> 0x20);
  auVar4._0_8_ = packet_callback_local;
  auVar4._12_4_ = 0x45300000;
  butter_lp<3>(&local_1b0,
               (auVar4._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)packet_callback_local) - 4503599627370496.0),750.0)
  ;
  iir_filter<3>::iir_filter(&this->lock_filter,&local_1b0);
  state_machine::symbol_sm_t::symbol_sm_t(&this->symbols_sm,packet_callback);
  state_machine::sample_sm_t::sample_sm_t
            (&this->samples_sm,(size_t)packet_callback_local,&this->symbols_sm);
  this->omega_c = 0.0;
  return;
}

Assistant:

demod_nrz(size_t sample_rate,
              std::function<void(uint8_t* begin, uint8_t* end)> packet_callback)
        : lp1(butter_lp<6>(sample_rate, 150000))
        , lp2(butter_lp<6>(sample_rate, 150000))
        , freq_filter(butter_lp<3>(sample_rate, 50000))
        , lock_filter(butter_lp<3>(sample_rate, 750))
        , symbols_sm(packet_callback)
        , samples_sm(sample_rate, symbols_sm)

    {
    }